

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_BuildFeatureSetDefaultsUnsupported_Test>
::CreateTest(TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_BuildFeatureSetDefaultsUnsupported_Test>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x88);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__CodeGeneratorTest_01925858;
  google::protobuf::DescriptorPool::DescriptorPool((DescriptorPool *)(this_00 + 1));
  this_00->_vptr_Test = (_func_int **)&PTR__CodeGeneratorTest_01925ef0;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }